

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeCursorWithCache(Vdbe *p,VdbeCursor *pCx)

{
  sqlite3 *in_RSI;
  VdbeCursor *in_RDI;
  VdbeTxtBlbCache *pCache;
  long *p_00;
  
  p_00 = *(long **)&in_RSI->bBenignMalloc;
  *(byte *)((long)&in_RSI->pVfs + 5) = *(byte *)((long)&in_RSI->pVfs + 5) & 0xef;
  in_RSI->bBenignMalloc = '\0';
  in_RSI->dfltLockMode = '\0';
  in_RSI->nextAutovac = '\0';
  in_RSI->suppressErr = '\0';
  in_RSI->vtabOnConflict = '\0';
  in_RSI->isTransactionSavepoint = '\0';
  in_RSI->mTrace = '\0';
  in_RSI->noSharedCache = '\0';
  if (*p_00 != 0) {
    sqlite3RCStrUnref(in_RSI);
    *p_00 = 0;
  }
  sqlite3DbFree(in_RSI,p_00);
  sqlite3VdbeFreeCursorNN((Vdbe *)pCache,in_RDI);
  return;
}

Assistant:

static SQLITE_NOINLINE void freeCursorWithCache(Vdbe *p, VdbeCursor *pCx){
  VdbeTxtBlbCache *pCache = pCx->pCache;
  assert( pCx->colCache );
  pCx->colCache = 0;
  pCx->pCache = 0;
  if( pCache->pCValue ){
    sqlite3RCStrUnref(pCache->pCValue);
    pCache->pCValue = 0;
  }
  sqlite3DbFree(p->db, pCache);
  sqlite3VdbeFreeCursorNN(p, pCx);
}